

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O1

bool __thiscall
HighsMipSolverData::trySolution
          (HighsMipSolverData *this,vector<double,_std::allocator<double>_> *solution,
          int solution_source)

{
  double *pdVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  pointer pdVar5;
  HighsLp *pHVar6;
  pointer pdVar7;
  pointer piVar8;
  bool bVar9;
  long lVar10;
  ulong uVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  
  pdVar5 = (solution->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pHVar6 = this->mipsolver->model_;
  uVar2 = pHVar6->num_col_;
  if (uVar2 == (uint)((ulong)((long)(solution->super__Vector_base<double,_std::allocator<double>_>).
                                    _M_impl.super__Vector_impl_data._M_finish - (long)pdVar5) >> 3))
  {
    if ((ulong)uVar2 == 0) {
      dVar14 = 0.0;
      dVar12 = 0.0;
    }
    else {
      pdVar7 = (pHVar6->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      dVar13 = this->feastol;
      uVar11 = 0;
      dVar14 = 0.0;
      dVar15 = 0.0;
      do {
        dVar16 = pdVar5[uVar11];
        if (dVar16 < pdVar7[uVar11] - dVar13) {
          return false;
        }
        if ((pHVar6->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar11] + dVar13 < dVar16) {
          return false;
        }
        if (((pHVar6->integrality_).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar11] == kInteger) &&
           (dVar12 = round(dVar16), dVar13 < ABS(dVar16 - dVar12))) {
          return false;
        }
        dVar16 = dVar16 * (pHVar6->col_cost_).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar11];
        dVar12 = dVar15 + dVar16;
        dVar14 = dVar14 + (dVar15 - (dVar12 - dVar16)) + (dVar16 - (dVar12 - (dVar12 - dVar16)));
        uVar11 = uVar11 + 1;
        dVar15 = dVar12;
      } while (uVar2 != uVar11);
    }
    piVar8 = (this->ARstart_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar11 = 0;
    do {
      if (uVar11 == (uint)pHVar6->num_row_) {
        bVar9 = addIncumbent(this,solution,dVar14 + dVar12,solution_source,true,false);
        return bVar9;
      }
      iVar3 = piVar8[uVar11];
      iVar4 = piVar8[uVar11 + 1];
      dVar13 = 0.0;
      if (iVar4 != iVar3) {
        lVar10 = 0;
        do {
          dVar13 = dVar13 + pdVar5[(this->ARindex_).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_start[iVar3 + lVar10]] *
                            (this->ARvalue_).super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start[iVar3 + lVar10];
          lVar10 = lVar10 + 1;
        } while (iVar4 - iVar3 != (int)lVar10);
      }
    } while ((dVar13 <= (pHVar6->row_upper_).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar11] + this->feastol) &&
            (pdVar1 = (pHVar6->row_lower_).super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start + uVar11, uVar11 = uVar11 + 1,
            *pdVar1 - this->feastol <= dVar13));
  }
  return false;
}

Assistant:

bool HighsMipSolverData::trySolution(const std::vector<double>& solution,
                                     const int solution_source) {
  if (int(solution.size()) != mipsolver.model_->num_col_) return false;

  HighsCDouble obj = 0;

  for (HighsInt i = 0; i != mipsolver.model_->num_col_; ++i) {
    if (solution[i] < mipsolver.model_->col_lower_[i] - feastol) return false;
    if (solution[i] > mipsolver.model_->col_upper_[i] + feastol) return false;
    if (mipsolver.variableType(i) == HighsVarType::kInteger &&
        fractionality(solution[i]) > feastol)
      return false;

    obj += mipsolver.colCost(i) * solution[i];
  }

  for (HighsInt i = 0; i != mipsolver.model_->num_row_; ++i) {
    double rowactivity = 0.0;

    HighsInt start = ARstart_[i];
    HighsInt end = ARstart_[i + 1];

    for (HighsInt j = start; j != end; ++j)
      rowactivity += solution[ARindex_[j]] * ARvalue_[j];

    if (rowactivity > mipsolver.rowUpper(i) + feastol) return false;
    if (rowactivity < mipsolver.rowLower(i) - feastol) return false;
  }

  return addIncumbent(solution, double(obj), solution_source);
}